

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

void __thiscall ClipperLib::Clipper::ProcessIntersectList(Clipper *this)

{
  IntersectNode *pIVar1;
  IntersectNode *pIVar2;
  
  pIVar2 = this->m_IntersectNodes;
  while (pIVar2 != (IntersectNode *)0x0) {
    pIVar1 = pIVar2->next;
    IntersectEdges(this,pIVar2->edge1,pIVar2->edge2,&pIVar2->pt,ipBoth);
    SwapPositionsInAEL(this,this->m_IntersectNodes->edge1,this->m_IntersectNodes->edge2);
    operator_delete(this->m_IntersectNodes);
    this->m_IntersectNodes = pIVar1;
    pIVar2 = pIVar1;
  }
  return;
}

Assistant:

void Clipper::ProcessIntersectList()
{
  while( m_IntersectNodes )
  {
    IntersectNode* iNode = m_IntersectNodes->next;
    {
      IntersectEdges( m_IntersectNodes->edge1 ,
        m_IntersectNodes->edge2 , m_IntersectNodes->pt, ipBoth );
      SwapPositionsInAEL( m_IntersectNodes->edge1 , m_IntersectNodes->edge2 );
    }
    delete m_IntersectNodes;
    m_IntersectNodes = iNode;
  }
}